

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsTTDNotifyYield(void)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  AutoNestedHandledExceptionType local_38 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 != (JsrtContext *)0x0) {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDRecordModeEnabled == true) {
      TTD::EventLog::RecordJsRTEventLoopYieldPoint(pSVar1->threadContext->TTDLog);
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDNotifyYield()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    if(cCheck != JsNoError)
    {
        return JsNoError; //we are ok just aren't going to do any TTD related work
    }

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(scriptContext->IsTTDRecordModeEnabled())
        {
            scriptContext->GetThreadContext()->TTDLog->RecordJsRTEventLoopYieldPoint();
        }

        return JsNoError;
    });
#endif
}